

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall State::apply(State *this,State *dst)

{
  rep rVar1;
  undefined7 uVar2;
  bool bVar3;
  undefined3 uVar4;
  float fVar5;
  Type TVar6;
  undefined2 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  
  if (this->update != false) {
    if ((this->flags).newMessage == true) {
      dst->update = true;
      (dst->flags).newMessage = true;
      uVar2 = *(undefined7 *)&(this->message).field_0x1;
      rVar1 = (this->message).timestamp.__d.__r;
      (dst->message).received = (this->message).received;
      *(undefined7 *)&(dst->message).field_0x1 = uVar2;
      (dst->message).timestamp.__d.__r = rVar1;
      std::__cxx11::string::operator=
                ((string *)&(dst->message).data,(string *)&(this->message).data);
      bVar3 = (this->message).dss;
      uVar4 = *(undefined3 *)&(this->message).field_0x35;
      fVar5 = (this->message).volume;
      TVar6 = (this->message).type;
      (dst->message).protocolId = (this->message).protocolId;
      (dst->message).dss = bVar3;
      *(undefined3 *)&(dst->message).field_0x35 = uVar4;
      (dst->message).volume = fVar5;
      (dst->message).type = TVar6;
    }
    if ((this->flags).newSpectrum == true) {
      dst->update = true;
      (dst->flags).newSpectrum = true;
      std::vector<float,_std::allocator<float>_>::_M_move_assign(&dst->rxSpectrum,&this->rxSpectrum)
      ;
    }
    if ((this->flags).newTxAmplitude == true) {
      dst->update = true;
      (dst->flags).newTxAmplitude = true;
      ggvector<short>::assign((ggvector *)&dst->txAmplitude);
    }
    if ((this->flags).newStats == true) {
      dst->update = true;
      (dst->flags).newStats = true;
      bVar3 = (this->stats).analyzing;
      uVar7 = *(undefined2 *)&(this->stats).field_0x2;
      iVar8 = (this->stats).framesToRecord;
      iVar9 = (this->stats).framesLeftToRecord;
      iVar10 = (this->stats).framesToAnalyze;
      iVar11 = (this->stats).framesLeftToAnalyze;
      iVar12 = (this->stats).samplesPerFrame;
      fVar5 = (this->stats).sampleRateInp;
      fVar13 = (this->stats).sampleRateOut;
      fVar14 = (this->stats).sampleRateOut;
      fVar15 = (this->stats).sampleRate;
      iVar16 = (this->stats).sampleSizeInp;
      iVar17 = (this->stats).sampleSizeOut;
      (dst->stats).receiving = (this->stats).receiving;
      (dst->stats).analyzing = bVar3;
      *(undefined2 *)&(dst->stats).field_0x2 = uVar7;
      (dst->stats).framesToRecord = iVar8;
      (dst->stats).framesLeftToRecord = iVar9;
      (dst->stats).framesToAnalyze = iVar10;
      (dst->stats).framesLeftToAnalyze = iVar11;
      (dst->stats).samplesPerFrame = iVar12;
      (dst->stats).sampleRateInp = fVar5;
      (dst->stats).sampleRateOut = fVar13;
      (dst->stats).sampleRateOut = fVar14;
      (dst->stats).sampleRate = fVar15;
      (dst->stats).sampleSizeInp = iVar16;
      (dst->stats).sampleSizeOut = iVar17;
    }
    if ((this->flags).newTxProtocols == true) {
      dst->update = true;
      (dst->flags).newTxProtocols = true;
      memcpy(&dst->txProtocols,&this->txProtocols,0x160);
    }
    (this->flags).newStats = false;
    (this->flags).newTxProtocols = false;
    this->update = false;
    (this->flags).newMessage = false;
    (this->flags).newSpectrum = false;
    (this->flags).newTxAmplitude = false;
  }
  return;
}

Assistant:

void apply(State & dst) {
        if (update == false) return;

        if (this->flags.newMessage) {
            dst.update = true;
            dst.flags.newMessage = true;
            dst.message = std::move(this->message);
        }

        if (this->flags.newSpectrum) {
            dst.update = true;
            dst.flags.newSpectrum = true;
            dst.rxSpectrum = std::move(this->rxSpectrum);
        }

        if (this->flags.newTxAmplitude) {
            dst.update = true;
            dst.flags.newTxAmplitude = true;
            dst.txAmplitude.assign(this->txAmplitude);
        }

        if (this->flags.newStats) {
            dst.update = true;
            dst.flags.newStats = true;
            dst.stats = std::move(this->stats);
        }

        if (this->flags.newTxProtocols) {
            dst.update = true;
            dst.flags.newTxProtocols = true;
            dst.txProtocols = std::move(this->txProtocols);
        }

        flags.clear();
        update = false;
    }